

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::findNextCompBoundary
          (Normalizer2Impl *this,UChar *p,UChar *limit,UBool onlyContiguous)

{
  UChar UVar1;
  ushort uVar2;
  int iVar3;
  UCPTrie *trie;
  UChar *pUVar4;
  uint c;
  bool bVar5;
  
  pUVar4 = p;
  if (p != limit) {
    do {
      p = pUVar4 + 1;
      UVar1 = *pUVar4;
      c = (uint)(ushort)UVar1;
      if ((c & 0xf800) == 0xd800) {
        if ((p == limit | (byte)((ushort)UVar1 >> 10) & 1) == 1) {
          trie = this->normTrie;
        }
        else {
          UVar1 = *p;
          trie = this->normTrie;
          if (((ushort)UVar1 & 0xfc00) == 0xdc00) {
            p = pUVar4 + 2;
            c = c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
            if ((int)c < trie->highStart) {
              iVar3 = ucptrie_internalSmallIndex_63(trie,c);
              trie = this->normTrie;
            }
            else {
              iVar3 = trie->dataLength + -2;
            }
            goto LAB_0028fcfd;
          }
        }
        iVar3 = trie->dataLength + -1;
      }
      else {
        trie = this->normTrie;
        iVar3 = (c & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
      }
LAB_0028fcfd:
      if (c < (ushort)this->minCompNoMaybeCP) {
        return pUVar4;
      }
      uVar2 = *(ushort *)((long)(trie->data).ptr0 + (long)iVar3 * 2);
      if (uVar2 < this->minNoNoCompNoMaybeCC) {
        return pUVar4;
      }
      if ((this->limitNoNo <= uVar2) && (uVar2 < this->minMaybeYes)) {
        return pUVar4;
      }
      if ((uVar2 & 1) != 0) {
        if (onlyContiguous == '\0') {
          return p;
        }
        if (uVar2 == 1) {
          return p;
        }
        if (uVar2 < this->limitNoNo) {
          bVar5 = *(ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffffffe)) < 0x200;
        }
        else {
          bVar5 = (uVar2 & 6) < 3;
        }
        if (bVar5) {
          return p;
        }
      }
      pUVar4 = p;
    } while (p != limit);
  }
  return p;
}

Assistant:

const UChar *Normalizer2Impl::findNextCompBoundary(const UChar *p, const UChar *limit,
                                                   UBool onlyContiguous) const {
    while (p != limit) {
        const UChar *codePointStart = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        if (hasCompBoundaryBefore(c, norm16)) {
            return codePointStart;
        }
        if (norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return p;
        }
    }
    return p;
}